

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putcontig8bitYCbCr22tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  byte bVar2;
  TIFFRGBAImage *pTVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 in_register_00000084;
  uint *puVar7;
  uint Cb;
  uint32_t g;
  uint32_t b;
  uint32_t local_7c;
  uint local_78;
  uint32_t local_74;
  TIFFRGBAImage *local_70;
  undefined8 local_68;
  ulong local_60;
  uint local_54;
  uint local_50;
  uint32_t local_4c;
  uint *local_48;
  long local_40;
  long local_38;
  
  uVar6 = CONCAT44(in_register_00000084,w);
  local_70 = img;
  if (1 < h) {
    puVar7 = cp + (ulong)w + (long)toskew;
    local_38 = (long)(int)(w + toskew * 2);
    local_40 = (long)(int)((fromskew - (fromskew >> 0x1f) & 0xfffffffeU) * 3);
    local_60 = CONCAT44(in_register_00000084,w);
    do {
      uVar5 = (uint)local_60;
      uVar6 = local_60 & 0xffffffff;
      local_4c = h;
      pTVar3 = local_70;
      while (local_70 = pTVar3, 1 < uVar5) {
        uVar4 = (ulong)local_68 >> 0x20;
        local_68 = (uint *)CONCAT44((int)uVar4,(int)uVar6);
        bVar1 = pp[4];
        Cb = (uint)bVar1;
        bVar2 = pp[5];
        uVar5 = (uint)bVar2;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)*pp,Cb,uVar5,&local_78,&local_7c,&local_74);
        *cp = local_74 << 0x10 | 0xff000000 | local_7c << 8 | local_78;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[1],(uint)bVar1,(uint)bVar2,&local_78,&local_7c,
                       &local_74);
        cp[1] = local_74 << 0x10 | 0xff000000 | local_7c << 8 | local_78;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[2],Cb,uVar5,&local_78,&local_7c,&local_74);
        *puVar7 = local_74 << 0x10 | 0xff000000 | local_7c << 8 | local_78;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[3],Cb,uVar5,&local_78,&local_7c,&local_74);
        puVar7[1] = local_74 << 0x10 | 0xff000000 | local_7c << 8 | local_78;
        cp = cp + 2;
        puVar7 = puVar7 + 2;
        pp = pp + 6;
        uVar5 = (int)local_68 - 2;
        uVar6 = (ulong)uVar5;
        pTVar3 = local_70;
      }
      local_68 = cp;
      local_48 = puVar7;
      if (uVar5 != 0) {
        local_50 = (uint)pp[4];
        local_54 = (uint)pp[5];
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)*pp,local_50,local_54,&local_78,&local_7c,&local_74);
        puVar7 = local_68;
        *local_68 = local_74 << 0x10 | 0xff000000 | local_7c << 8 | local_78;
        TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[2],local_50,local_54,&local_78,&local_7c,&local_74);
        *local_48 = local_74 << 0x10 | 0xff000000 | local_7c << 8 | local_78;
        cp = puVar7 + 1;
        puVar7 = local_48 + 1;
        pp = pp + 6;
      }
      pp = pp + local_40;
      cp = cp + local_38;
      puVar7 = puVar7 + local_38;
      h = local_4c - 2;
      uVar6 = local_60;
    } while (1 < h);
  }
  pTVar3 = local_70;
  if (h != 0) {
    uVar5 = (uint)uVar6;
    uVar4 = local_60;
    while (local_60 = uVar6, 1 < uVar5) {
      bVar1 = pp[4];
      bVar2 = pp[5];
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)*pp,(uint)bVar1,(uint)bVar2,&local_78,&local_7c,&local_74);
      *cp = local_74 << 0x10 | 0xff000000 | local_7c << 8 | local_78;
      TIFFYCbCrtoRGB(pTVar3->ycbcr,(uint)pp[1],(uint)bVar1,(uint)bVar2,&local_78,&local_7c,&local_74
                    );
      cp[1] = local_74 << 0x10 | 0xff000000 | local_7c << 8 | local_78;
      cp = cp + 2;
      pp = pp + 6;
      uVar5 = (int)local_60 - 2;
      uVar6 = (ulong)uVar5;
      uVar4 = local_60;
    }
    if ((int)local_60 != 0) {
      local_60 = uVar4;
      TIFFYCbCrtoRGB(local_70->ycbcr,(uint)*pp,(uint)pp[4],(uint)pp[5],&local_78,&local_7c,&local_74
                    );
      *cp = local_7c << 8 | local_78 | local_74 << 0x10 | 0xff000000;
    }
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr22tile)
{
    uint32_t *cp2;
    int32_t incr = 2 * toskew + w;
    (void)y;
    fromskew = (fromskew / 2) * (2 * 2 + 2);
    cp2 = cp + w + toskew;
    while (h >= 2)
    {
        x = w;
        while (x >= 2)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            YCbCrtoRGB(cp2[0], pp[2]);
            YCbCrtoRGB(cp2[1], pp[3]);
            cp += 2;
            cp2 += 2;
            pp += 6;
            x -= 2;
        }
        if (x == 1)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp2[0], pp[2]);
            cp++;
            cp2++;
            pp += 6;
        }
        cp += incr;
        cp2 += incr;
        pp += fromskew;
        h -= 2;
    }
    if (h == 1)
    {
        x = w;
        while (x >= 2)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);
            cp += 2;
            cp2 += 2;
            pp += 6;
            x -= 2;
        }
        if (x == 1)
        {
            uint32_t Cb = pp[4];
            uint32_t Cr = pp[5];
            YCbCrtoRGB(cp[0], pp[0]);
        }
    }
}